

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O2

int beagleGetSiteDerivatives(int instance,double *outFirstDerivatives,double *outSecondDerivatives)

{
  int iVar1;
  BeagleImpl *pBVar2;
  
  pBVar2 = beagle::getBeagleInstance(instance);
  if (pBVar2 != (BeagleImpl *)0x0) {
    iVar1 = (**(code **)(*(long *)pBVar2 + 0x188))
                      (pBVar2,outFirstDerivatives,outSecondDerivatives,
                       *(code **)(*(long *)pBVar2 + 0x188));
    return iVar1;
  }
  return -4;
}

Assistant:

int beagleGetSiteDerivatives(int instance,
                             double* outFirstDerivatives,
                             double* outSecondDerivatives) {
    DEBUG_START_TIME();
    beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
    if (beagleInstance == NULL)
        return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
    int returnValue = beagleInstance->getSiteDerivatives(outFirstDerivatives, outSecondDerivatives);
    DEBUG_END_TIME();

#ifdef BEAGLE_DEBUG_FP_REDUCED_PRECISION
        union {double f; long l;} dfp;
        for(int i=0; i < debugPatternCount; i++) {
            dfp.f = outFirstDerivatives[i];
            dfp.l = dfp.l & FP_REDUCED_PRECISION_MASK;
            outFirstDerivatives[i] = dfp.f;
            dfp.f = outSecondDerivatives[i];
            dfp.l = dfp.l & FP_REDUCED_PRECISION_MASK;
            outSecondDerivatives[i] = dfp.f;
        }
#endif

    return returnValue;
}